

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fColorClearTest.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles2::Functional::ColorClearCase::iterate(ColorClearCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  uint width;
  uint height;
  int iVar3;
  TestLog *this_00;
  RenderContext *context;
  char cVar4;
  int iVar5;
  uint uVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  int iVar11;
  RGBA RVar12;
  undefined4 extraout_var;
  RenderTarget *pRVar13;
  pointer pCVar14;
  ostream *poVar15;
  undefined4 uVar16;
  Surface *pSVar17;
  int iVar18;
  uint uVar19;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  byte bVar20;
  uint uVar21;
  IterateResult IVar22;
  ChannelOrder CVar23;
  uint uVar24;
  ChannelOrder CVar25;
  pointer pCVar26;
  uint uVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  RGBA thr;
  long lVar31;
  long lVar32;
  uint uVar33;
  ChannelType CVar34;
  long lVar35;
  ulong uVar36;
  bool bVar37;
  vector<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
  clearOps;
  Surface resImage;
  Surface refImage;
  Random rnd;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixelKnownChannelMask;
  Surface diffImage;
  vector<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
  scanlineClearOps;
  int local_4e4;
  string local_4c8;
  uint local_4a4;
  uint local_4a0;
  int local_49c;
  ChannelOrder local_498;
  ChannelType local_494;
  uint local_490;
  uint local_48c;
  vector<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
  local_488;
  Surface local_468;
  string local_450;
  Surface local_430;
  deRandom local_418;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_408;
  string local_3f0;
  string local_3d0;
  LogImageSet local_3b0;
  Surface local_370;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  LogImage local_2d8;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [4];
  ios_base local_1d0 [272];
  LogImage local_c0;
  
  this_00 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar31 = CONCAT44(extraout_var,iVar5);
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  width = pRVar13->m_width;
  height = pRVar13->m_height;
  uVar6 = ((uint)this->m_curIter >> 0x10 ^ this->m_curIter ^ 0x3d) * 9;
  uVar6 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d;
  deRandom_init(&local_418,uVar6 >> 0xf ^ uVar6);
  local_248 = (undefined1  [8])((ulong)local_248 & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_408,(long)(int)(height * width),local_248,(allocator_type *)&local_2d8);
  tcu::Surface::Surface(&local_430,width,height);
  tcu::Surface::Surface(&local_468,width,height);
  tcu::Surface::Surface(&local_370,width,height);
  dVar7 = deRandom_getUint32(&local_418);
  local_49c = this->m_numClearsMin;
  iVar5 = this->m_numClearsMax;
  local_488.
  super__Vector_base<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.
  super__Vector_base<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.
  super__Vector_base<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->m_testScissoring == true) {
    (**(code **)(lVar31 + 0x5e0))();
  }
  local_49c = dVar7 % ((iVar5 - local_49c) + 1U) + local_49c;
  if (0 < local_49c) {
    local_4a0 = width * 2;
    local_4a4 = height * 2;
    local_4e4 = 0;
    do {
      CVar34 = SNORM_INT8;
      CVar23 = R;
      uVar6 = width;
      uVar33 = height;
      if ((this->m_testScissoring == true) &&
         ((local_4e4 != 0 || (this->m_firstClearFull == false)))) {
        dVar7 = deRandom_getUint32(&local_418);
        uVar6 = dVar7 % local_4a0;
        dVar7 = deRandom_getUint32(&local_418);
        uVar33 = dVar7 % local_4a4;
        dVar7 = deRandom_getUint32(&local_418);
        dVar8 = deRandom_getUint32(&local_418);
        CVar23 = uVar6 - width;
        CVar34 = uVar33 - height;
        uVar6 = dVar7 % width;
        uVar33 = dVar8 % height;
      }
      local_490 = uVar33;
      local_48c = uVar6;
      (**(code **)(lVar31 + 0x1290))(CVar23,CVar34,uVar6);
      dVar7 = deRandom_getUint32(&local_418);
      dVar8 = deRandom_getUint32(&local_418);
      local_494 = CVar34;
      dVar9 = deRandom_getUint32(&local_418);
      uVar6 = 0xff;
      if (this->m_testAlpha == true) {
        dVar10 = deRandom_getUint32(&local_418);
        uVar6 = dVar10 & 0xff;
      }
      local_498 = CVar23;
      (**(code **)(lVar31 + 0x1c0))
                ((float)(dVar7 & 0xff) / 255.0,(float)(dVar8 & 0xff) / 255.0,
                 (float)(dVar9 & 0xff) / 255.0,(float)uVar6 / 255.0);
      uVar28 = 0xf;
      if ((this->m_testColorMasks == true) &&
         ((local_4e4 != 0 || (this->m_firstClearFull == false)))) {
        dVar10 = deRandom_getUint32(&local_418);
        uVar28 = (ulong)dVar10 & 0xffffffffffffff0f;
      }
      bVar20 = (byte)uVar28;
      (**(code **)(lVar31 + 0x238))(bVar20 & 1,(byte)(uVar28 >> 1) & 1,bVar20 >> 2 & 1,7 < bVar20);
      (**(code **)(lVar31 + 0x188))(0x4000);
      local_248._4_4_ = local_494;
      local_248._0_4_ = local_498;
      uStack_240 = (pointer)CONCAT44(local_490,local_48c);
      local_238._M_allocated_capacity._0_1_ = bVar20;
      local_238._M_allocated_capacity._4_4_ =
           (dVar9 & 0xff) << 0x10 | (dVar8 & 0xff) << 8 | uVar6 << 0x18 | dVar7 & 0xff;
      std::
      vector<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
      ::emplace_back<deqp::gles2::Functional::ClearInfo>(&local_488,(ClearInfo *)local_248);
      tcu::TestContext::touchWatchdog
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      local_4e4 = local_4e4 + 1;
    } while (local_4e4 < local_49c);
  }
  if (0 < (int)height) {
    iVar5 = 0;
    uVar6 = 0;
    do {
      local_248._0_4_ = R;
      local_248._4_4_ = SNORM_INT8;
      uStack_240 = (pointer)0x0;
      local_238._M_allocated_capacity = 0;
      if (0 < (int)((ulong)((long)local_488.
                                  super__Vector_base<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_488.
                                 super__Vector_base<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        lVar35 = 0;
        lVar32 = 0;
        pCVar14 = local_488.
                  super__Vector_base<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pCVar26 = local_488.
                  super__Vector_base<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          iVar11 = *(int *)((long)(pCVar26->m_rect).m_data + lVar35 + 4);
          if ((iVar11 <= (int)uVar6) &&
             ((int)uVar6 < iVar11 + *(int *)((long)(pCVar26->m_rect).m_data + lVar35 + 0xc))) {
            std::
            vector<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
            ::push_back((vector<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
                         *)local_248,(value_type *)((long)(pCVar26->m_rect).m_data + lVar35));
            pCVar14 = local_488.
                      super__Vector_base<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pCVar26 = local_488.
                      super__Vector_base<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          lVar32 = lVar32 + 1;
          lVar35 = lVar35 + 0x18;
        } while (lVar32 < (int)((ulong)((long)pCVar14 - (long)pCVar26) >> 3) * -0x55555555);
      }
      if (0 < (int)width) {
        iVar11 = 0;
        do {
          uVar33 = width - iVar11;
          iVar29 = (int)((ulong)((long)uStack_240 - (long)local_248) >> 3) * -0x55555555;
          uVar27 = 0;
          bVar20 = 0;
LAB_00fd4f6a:
          uVar19 = iVar29 - 1;
          while (-1 < (int)uVar19) {
            uVar21 = iVar29 - 2;
            iVar30 = iVar29;
            while( true ) {
              iVar29 = iVar29 + -1;
              uVar28 = (ulong)uVar19;
              iVar3 = *(int *)((long)local_248 + uVar28 * 0x18);
              if ((iVar3 <= iVar11) &&
                 (iVar18 = *(int *)((char *)((long)local_248 + 8) + uVar28 * 0x18) + iVar3,
                 uVar19 = iVar18 - iVar11, uVar19 != 0 && iVar11 <= iVar18)) {
                lVar32 = (long)local_248 + uVar28 * 0x18;
                if ((*(int *)(lVar32 + 4) <= (int)uVar6) &&
                   ((int)uVar6 < *(int *)(lVar32 + 4) + *(int *)(lVar32 + 0xc))) {
                  if ((int)uVar33 < (int)uVar19) {
                    uVar19 = uVar33;
                  }
                  uVar33 = uVar19;
                  uVar19 = *(uint *)(lVar32 + 0x14);
                  uVar21 = uVar27 & 0xffffff00 | uVar19 & 0xff;
                  if ((bVar20 & 1) != 0) {
                    uVar21 = uVar27;
                  }
                  bVar2 = *(byte *)(lVar32 + 0x10);
                  if ((bVar2 & 1) == 0) {
                    uVar21 = uVar27;
                  }
                  uVar27 = uVar21 & 0xffff00ff | uVar19 & 0xff00;
                  if ((bVar20 & 2) != 0) {
                    uVar27 = uVar21;
                  }
                  if ((bVar2 & 2) == 0) {
                    uVar27 = uVar21;
                  }
                  uVar21 = uVar27 & 0xff00ffff | uVar19 & 0xff0000;
                  if ((bVar20 & 4) != 0) {
                    uVar21 = uVar27;
                  }
                  if ((bVar2 & 4) == 0) {
                    uVar21 = uVar27;
                  }
                  uVar27 = uVar21 & 0xffffff | uVar19 & 0xff000000;
                  if ((bVar20 & 8) != 0) {
                    uVar27 = uVar21;
                  }
                  if ((bVar2 & 8) == 0) {
                    uVar27 = uVar21;
                  }
                  bVar20 = bVar2 | bVar20;
                  if (bVar20 != 0xf) goto LAB_00fd4f6a;
                  bVar20 = 0xf;
                  goto LAB_00fd5096;
                }
              }
              uVar24 = iVar3 - iVar11;
              if (uVar24 != 0 && iVar11 <= iVar3) break;
              uVar19 = iVar30 - 2;
              bVar37 = (int)uVar21 < 0;
              uVar21 = uVar21 - 1;
              iVar30 = iVar30 + -1;
              if (bVar37) goto LAB_00fd5096;
            }
            uVar19 = uVar21;
            if ((int)uVar24 <= (int)uVar33) {
              uVar33 = uVar24;
            }
          }
LAB_00fd5096:
          uVar19 = uVar27 | 0xff000000;
          if ((pRVar13->m_pixelFormat).alphaBits != 0) {
            uVar19 = uVar27;
          }
          if (0 < (int)uVar33) {
            uVar28 = (ulong)uVar33;
            iVar29 = iVar11;
            do {
              *(uint *)((long)local_430.m_pixels.m_ptr +
                       (long)(int)(local_430.m_width * uVar6 + iVar29) * 4) = uVar19;
              local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[iVar5 + iVar29] =
                   local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar5 + iVar29] | bVar20;
              iVar29 = iVar29 + 1;
              uVar28 = uVar28 - 1;
            } while (uVar28 != 0);
          }
          iVar11 = iVar11 + uVar33;
        } while (iVar11 < (int)width);
      }
      if ((TextureFormat)local_248 != (TextureFormat)0x0) {
        operator_delete((void *)local_248,local_238._M_allocated_capacity - (long)local_248);
      }
      uVar6 = uVar6 + 1;
      iVar5 = iVar5 + width;
    } while (uVar6 != height);
  }
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2d8.m_name._M_dataplus._M_p = (char *)0x300000008;
  if ((void *)local_468.m_pixels.m_cap != (void *)0x0) {
    local_468.m_pixels.m_cap = (size_t)local_468.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_248,(TextureFormat *)&local_2d8,local_468.m_width,
             local_468.m_height,1,(void *)local_468.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_248);
  dVar7 = (**(code **)(lVar31 + 0x800))();
  glu::checkError(dVar7,"glReadPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fColorClearTest.cpp"
                  ,0xe9);
  iVar5 = (pRVar13->m_pixelFormat).alphaBits;
  bVar20 = 8 - (char)(pRVar13->m_pixelFormat).redBits;
  uVar6 = 0;
  if (0 < iVar5) {
    uVar6 = 0x1000000 << (8U - (char)iVar5 & 0x1f);
  }
  iVar5 = (pRVar13->m_pixelFormat).greenBits;
  iVar11 = (pRVar13->m_pixelFormat).blueBits;
  cVar4 = (**(code **)(lVar31 + 0xc70))(0xbd0);
  thr.m_value = 0x100 << (8U - (char)iVar5 & 0x1f) | 0x10000 << (8U - (char)iVar11 & 0x1f) | uVar6 |
                1 << (bVar20 & 0x1f);
  if (cVar4 != '\0') {
    uVar6 = thr.m_value & 0xffffff00 | (1 << (bVar20 & 0x1f) & 0xffU) + 1;
    uVar6 = (uVar6 & 0xff00) + 0x100 | uVar6 & 0xffff00ff;
    thr.m_value = ((uVar6 & 0xff0000) + 0x10000 | uVar6 & 0xff00ffff) + 0x1000000;
  }
  iVar5 = (int)this_00;
  if (0 < (int)height) {
    bVar20 = 1;
    lVar31 = 0;
    uVar6 = 0;
    uVar28 = 0;
    do {
      if (0 < (int)width) {
        uVar36 = 0;
        do {
          iVar11 = (int)uVar36;
          RVar12 = tcu::computeAbsDiffMasked
                             (*(deUint32 *)
                               ((long)local_430.m_pixels.m_ptr +
                               (long)(int)(local_430.m_width * uVar6 + iVar11) * 4),
                              *(deUint32 *)
                               ((long)local_468.m_pixels.m_ptr +
                               (long)(int)(local_468.m_width * uVar6 + iVar11) * 4),
                              (uint)local_408.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(int)lVar31 + iVar11])
          ;
          local_248._0_4_ = RVar12.m_value;
          bVar37 = tcu::RGBA::isBelowThreshold((RGBA *)local_248,thr);
          uVar16 = 0xff0000ff;
          if (bVar37) {
            uVar16 = 0xff00ff00;
          }
          *(undefined4 *)
           ((long)local_370.m_pixels.m_ptr + (long)(int)(local_370.m_width * uVar6 + iVar11) * 4) =
               uVar16;
          CVar25 = (ChannelOrder)uVar28 & 0xff;
          CVar23 = local_248._0_4_ & 0xff;
          if ((local_248._0_4_ & 0xff) < CVar25) {
            CVar23 = CVar25;
          }
          uVar27 = (uint)(uVar28 >> 8) & 0xff;
          uVar33 = (uint)local_248._0_4_ >> 8 & 0xff;
          if (uVar33 < uVar27) {
            uVar33 = uVar27;
          }
          uVar19 = (uint)(uVar28 >> 0x10) & 0xff;
          uVar27 = (uint)local_248._0_4_ >> 0x10 & 0xff;
          if (uVar27 < uVar19) {
            uVar27 = uVar19;
          }
          uVar21 = (ChannelOrder)uVar28 >> 0x18;
          uVar19 = (uint)local_248._0_4_ >> 0x18;
          if ((uint)local_248._0_4_ >> 0x18 < uVar21) {
            uVar19 = uVar21;
          }
          uVar28 = (ulong)(uVar27 << 0x10 | uVar33 << 8 | CVar23 | uVar19 << 0x18);
          bVar20 = bVar20 & bVar37;
          uVar36 = uVar36 + 1;
        } while (width != uVar36);
      }
      uVar6 = uVar6 + 1;
      lVar31 = lVar31 + (ulong)width;
    } while (uVar6 != height);
    if (bVar20 == 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
      local_248 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_240);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_240,"Image comparison failed, max diff = ",0x24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_240,"RGBA(",5);
      poVar15 = (ostream *)
                std::ostream::operator<<((ostringstream *)&uStack_240,(uint)uVar28 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,", ",2);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,(uint)(byte)(uVar28 >> 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,", ",2);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,(uint)(uVar28 >> 0x10) & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,", ",2);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,(uint)uVar28 >> 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,")",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_240,", threshold = ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_240,"RGBA(",5);
      poVar15 = (ostream *)std::ostream::operator<<((ostringstream *)&uStack_240,thr.m_value & 0xff)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,", ",2);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,thr.m_value >> 8 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,", ",2);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,thr.m_value >> 0x10 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,", ",2);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,thr.m_value >> 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_240);
      std::ios_base::~ios_base(local_1d0);
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"Result","");
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_450,"Resulting framebuffer","");
      tcu::LogImageSet::LogImageSet(&local_3b0,&local_4c8,&local_450);
      tcu::TestLog::startImageSet
                (this_00,local_3b0.m_name._M_dataplus._M_p,local_3b0.m_description._M_dataplus._M_p)
      ;
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Result","");
      local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3d0,"Resulting framebuffer","");
      pSVar17 = &local_468;
      tcu::LogImage::LogImage
                ((LogImage *)local_248,&local_2f8,&local_3d0,pSVar17,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)local_248,iVar5,__buf_00,(size_t)pSVar17);
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Reference","");
      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"Reference image","");
      pSVar17 = &local_430;
      tcu::LogImage::LogImage
                (&local_2d8,&local_318,&local_3f0,pSVar17,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_2d8,iVar5,__buf_01,(size_t)pSVar17);
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"DiffMask","");
      local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Failing pixels","");
      pSVar17 = &local_370;
      tcu::LogImage::LogImage
                (&local_c0,&local_338,&local_358,pSVar17,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_c0,iVar5,__buf_02,(size_t)pSVar17);
      tcu::TestLog::endImageSet(this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.m_description._M_dataplus._M_p != &local_c0.m_description.field_2) {
        operator_delete(local_c0.m_description._M_dataplus._M_p,
                        local_c0.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.m_name._M_dataplus._M_p != &local_c0.m_name.field_2) {
        operator_delete(local_c0.m_name._M_dataplus._M_p,
                        local_c0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.m_description._M_dataplus._M_p != &local_2d8.m_description.field_2) {
        operator_delete(local_2d8.m_description._M_dataplus._M_p,
                        local_2d8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.m_name._M_dataplus._M_p != &local_2d8.m_name.field_2) {
        operator_delete(local_2d8.m_name._M_dataplus._M_p,
                        local_2d8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_p != local_218) {
        operator_delete(local_228._M_p,local_218[0]._M_allocated_capacity + 1);
      }
      if (local_248 != (undefined1  [8])&local_238) {
        operator_delete((void *)local_248,(ulong)(local_238._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0.m_description._M_dataplus._M_p != &local_3b0.m_description.field_2) {
        operator_delete(local_3b0.m_description._M_dataplus._M_p,
                        local_3b0.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0.m_name._M_dataplus._M_p != &local_3b0.m_name.field_2) {
        operator_delete(local_3b0.m_name._M_dataplus._M_p,
                        local_3b0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
      IVar22 = STOP;
      goto LAB_00fd5c1e;
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  iVar11 = this->m_numIters;
  iVar29 = this->m_curIter + 1;
  this->m_curIter = iVar29;
  if (iVar29 == iVar11) {
    paVar1 = &local_c0.m_name.field_2;
    local_c0.m_name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Result","");
    local_3b0.m_name._M_dataplus._M_p = (pointer)&local_3b0.m_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"Resulting framebuffer","")
    ;
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_2d8,&local_c0.m_name,&local_3b0.m_name);
    tcu::TestLog::startImageSet
              (this_00,local_2d8.m_name._M_dataplus._M_p,local_2d8.m_description._M_dataplus._M_p);
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"Result","");
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Resulting framebuffer","")
    ;
    pSVar17 = &local_468;
    tcu::LogImage::LogImage
              ((LogImage *)local_248,&local_4c8,&local_450,pSVar17,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_248,iVar5,__buf,(size_t)pSVar17);
    tcu::TestLog::endImageSet(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_p != local_218) {
      operator_delete(local_228._M_p,local_218[0]._M_allocated_capacity + 1);
    }
    if (local_248 != (undefined1  [8])&local_238) {
      operator_delete((void *)local_248,(ulong)(local_238._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.m_description._M_dataplus._M_p != &local_2d8.m_description.field_2) {
      operator_delete(local_2d8.m_description._M_dataplus._M_p,
                      local_2d8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.m_name._M_dataplus._M_p != &local_2d8.m_name.field_2) {
      operator_delete(local_2d8.m_name._M_dataplus._M_p,
                      local_2d8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.m_name._M_dataplus._M_p != &local_3b0.m_name.field_2) {
      operator_delete(local_3b0.m_name._M_dataplus._M_p,
                      local_3b0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.m_name._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.m_name._M_dataplus._M_p,
                      local_c0.m_name.field_2._M_allocated_capacity + 1);
    }
  }
  IVar22 = (IterateResult)(iVar29 != iVar11);
LAB_00fd5c1e:
  if (local_488.
      super__Vector_base<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.
                    super__Vector_base<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_488.
                          super__Vector_base<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.
                          super__Vector_base<deqp::gles2::Functional::ClearInfo,_std::allocator<deqp::gles2::Functional::ClearInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_370);
  tcu::Surface::~Surface(&local_468);
  tcu::Surface::~Surface(&local_430);
  if (local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return IVar22;
}

Assistant:

TestCase::IterateResult ColorClearCase::iterate (void)
{
	TestLog&					log						= m_testCtx.getLog();
	const glw::Functions&		gl						= m_context.getRenderContext().getFunctions();
	const tcu::RenderTarget&	renderTarget			= m_context.getRenderTarget();
	const tcu::PixelFormat&		pixelFormat				= renderTarget.getPixelFormat();
	const int					targetWidth				= renderTarget.getWidth();
	const int					targetHeight			= renderTarget.getHeight();
	const int					numPixels				= targetWidth * targetHeight;

	de::Random					rnd						(deInt32Hash(m_curIter));
	vector<deUint8>				pixelKnownChannelMask	(numPixels, 0);
	Surface						refImage				(targetWidth, targetHeight);
	Surface						resImage				(targetWidth, targetHeight);
	Surface						diffImage				(targetWidth, targetHeight);
	int							numClears				= rnd.getUint32() % (m_numClearsMax + 1 - m_numClearsMin) + m_numClearsMin;
	std::vector<ClearInfo>		clearOps;

	if (m_testScissoring)
		gl.enable(GL_SCISSOR_TEST);

	for (int clearNdx = 0; clearNdx < numClears; clearNdx++)
	{
		// Rectangle.
		int clearX;
		int clearY;
		int clearWidth;
		int clearHeight;
		if (!m_testScissoring || (clearNdx == 0 && m_firstClearFull))
		{
			clearX		= 0;
			clearY		= 0;
			clearWidth	= targetWidth;
			clearHeight	= targetHeight;
		}
		else
		{
			clearX		= (rnd.getUint32() % (2*targetWidth)) - targetWidth;
			clearY		= (rnd.getUint32() % (2*targetHeight)) - targetHeight;
			clearWidth	= (rnd.getUint32() % targetWidth);
			clearHeight	= (rnd.getUint32() % targetHeight);
		}
		gl.scissor(clearX, clearY, clearWidth, clearHeight);

		// Color.
		int		r = (int)(rnd.getUint32() & 0xFF);
		int		g = (int)(rnd.getUint32() & 0xFF);
		int		b = (int)(rnd.getUint32() & 0xFF);
		int		a = m_testAlpha ? (int)(rnd.getUint32() & 0xFF) : 0xFF;
		RGBA	clearCol(r, g, b, a);
		gl.clearColor(float(r)/255.0f, float(g)/255.0f, float(b)/255.0f, float(a)/255.0f);

		// Mask.
		deUint8	clearMask;
		if (!m_testColorMasks || (clearNdx == 0 && m_firstClearFull))
			clearMask = 0xF;
		else
			clearMask = (rnd.getUint32() & 0xF);
		gl.colorMask((clearMask&0x1) != 0, (clearMask&0x2) != 0, (clearMask&0x4) != 0, (clearMask&0x8) != 0);

		// Clear & store op.
		gl.clear(GL_COLOR_BUFFER_BIT);
		clearOps.push_back(ClearInfo(tcu::IVec4(clearX, clearY, clearWidth, clearHeight), clearMask, clearCol));

		// Let watchdog know we're alive.
		m_testCtx.touchWatchdog();
	}

	// Compute reference image.
	{
		for (int y = 0; y < targetHeight; y++)
		{
			std::vector<ClearInfo>	scanlineClearOps;

			// Find all rectangles affecting this scanline.
			for (int opNdx = 0; opNdx < (int)clearOps.size(); opNdx++)
			{
				ClearInfo& op = clearOps[opNdx];
				if (de::inBounds(y, op.m_rect.y(), op.m_rect.y()+op.m_rect.w()))
					scanlineClearOps.push_back(op);
			}

			// Compute reference for scanline.
			int x = 0;
			while (x < targetWidth)
			{
				tcu::RGBA	spanColor;
				deUint8		spanKnownMask	= 0;
				int			spanLength		= (targetWidth - x);

				for (int opNdx = (int)scanlineClearOps.size() - 1; opNdx >= 0; opNdx--)
				{
					const ClearInfo& op = scanlineClearOps[opNdx];

					if (de::inBounds(x, op.m_rect.x(), op.m_rect.x()+op.m_rect.z()) &&
						de::inBounds(y, op.m_rect.y(), op.m_rect.y()+op.m_rect.w()))
					{
						// Compute span length until end of given rectangle.
						spanLength = deMin32(spanLength, op.m_rect.x() + op.m_rect.z() - x);

						tcu::RGBA	clearCol	= op.m_color;
						deUint8		clearMask	= op.m_colorMask;
						if ((clearMask & 0x1) && !(spanKnownMask & 0x1)) spanColor.setRed(clearCol.getRed());
						if ((clearMask & 0x2) && !(spanKnownMask & 0x2)) spanColor.setGreen(clearCol.getGreen());
						if ((clearMask & 0x4) && !(spanKnownMask & 0x4)) spanColor.setBlue(clearCol.getBlue());
						if ((clearMask & 0x8) && !(spanKnownMask & 0x8)) spanColor.setAlpha(clearCol.getAlpha());
						spanKnownMask |= clearMask;

						// Break if have all colors.
						if (spanKnownMask == 0xF)
							break;
					}
					else if (op.m_rect.x() > x)
						spanLength = deMin32(spanLength, op.m_rect.x() - x);
				}

				// Set reference alpha channel to 0xFF, if no alpha in target.
				if (pixelFormat.alphaBits == 0)
					spanColor.setAlpha(0xFF);

				// Fill the span.
				for (int ndx = 0; ndx < spanLength; ndx++)
				{
					refImage.setPixel(x + ndx, y, spanColor);
					pixelKnownChannelMask[y*targetWidth + x + ndx] |= spanKnownMask;
				}

				x += spanLength;
			}
		}
	}

	glu::readPixels(m_context.getRenderContext(), 0, 0, resImage.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels");

	// Compute difference image.
	RGBA colorThreshold = pixelFormat.getColorThreshold();
	RGBA matchColor(0, 255, 0, 255);
	RGBA diffColor(255, 0, 0, 255);
	RGBA maxDiff(0, 0, 0, 0);
	bool isImageOk = true;

	if (gl.isEnabled(GL_DITHER))
	{
		colorThreshold.setRed(colorThreshold.getRed() + 1);
		colorThreshold.setGreen(colorThreshold.getGreen() + 1);
		colorThreshold.setBlue(colorThreshold.getBlue() + 1);
		colorThreshold.setAlpha(colorThreshold.getAlpha() + 1);
	}

	for (int y = 0; y < targetHeight; y++)
	for (int x = 0; x < targetWidth; x++)
	{
		int			offset		= (y*targetWidth + x);
		RGBA		refRGBA		= refImage.getPixel(x, y);
		RGBA		resRGBA		= resImage.getPixel(x, y);
		deUint8		colMask		= pixelKnownChannelMask[offset];
		RGBA		diff		= computeAbsDiffMasked(refRGBA, resRGBA, colMask);
		bool		isPixelOk	= diff.isBelowThreshold(colorThreshold);

		diffImage.setPixel(x, y, isPixelOk ? matchColor : diffColor);

		isImageOk	= isImageOk && isPixelOk;
		maxDiff		= max(maxDiff, diff);
	}

	if (isImageOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		m_testCtx.getLog() << tcu::TestLog::Message << "Image comparison failed, max diff = " << maxDiff << ", threshold = " << colorThreshold << tcu::TestLog::EndMessage;

		log << TestLog::ImageSet("Result", "Resulting framebuffer")
			<< TestLog::Image("Result",		"Resulting framebuffer",	resImage)
			<< TestLog::Image("Reference",	"Reference image",			refImage)
			<< TestLog::Image("DiffMask",	"Failing pixels",			diffImage)
			<< TestLog::EndImageSet;
		return TestCase::STOP;
	}

	bool isFinal = (++m_curIter == m_numIters);

	// On final frame, dump images.
	if (isFinal)
	{
		log << TestLog::ImageSet("Result", "Resulting framebuffer")
			<< TestLog::Image("Result",		"Resulting framebuffer",	resImage)
			<< TestLog::EndImageSet;
	}

	return isFinal ? TestCase::STOP : TestCase::CONTINUE;
}